

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,uint loopId,RegSlot *curRegs)

{
  uint uVar1;
  long lVar2;
  undefined2 local_14;
  undefined2 auStack_12 [3];
  OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((DAT_0143bfdd == '\0') && (local_14 = (undefined2)loopId, loopId < 0x10000)) {
    lVar2 = 0;
    do {
      if ((int)lVar2 == 5) {
        ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
                  (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_14,0xc,
                   &this->super_ByteCodeWriter,false);
        return true;
      }
      uVar1 = curRegs[lVar2];
      auStack_12[lVar2] = (short)uVar1;
      lVar2 = lVar2 + 1;
    } while (uVar1 < 0x10000);
  }
  return false;
}

Assistant:

bool WasmByteCodeWriter::TryWriteWasmLoopStart(OpCodeAsmJs op, uint loopId, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    OpLayoutT_WasmLoopStart<SizePolicy> layout;
    if (SizePolicy::Assign(layout.loopId, loopId))
    {
        for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
        {
            if (!SizePolicy::Assign(layout.curRegs[type], curRegs[type]))
            {
                return false;
            }
        }

        m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
        return true;
    }
    return false;
}